

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

bool wal_txn_exists(filemgr *file)

{
  long in_RDI;
  fdb_txn *txn;
  wal_txn_wrapper *txn_wrapper;
  list_elem *le;
  list_elem *local_18;
  
  pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
  local_18 = list_begin((list *)(*(long *)(in_RDI + 0x48) + 0x20));
  while( true ) {
    if (local_18 == (list_elem *)0x0) {
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
      return false;
    }
    if (local_18[1].prev != (list_elem *)(in_RDI + 0x130)) break;
    local_18 = list_next(local_18);
  }
  pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x48) + 0x60));
  return true;
}

Assistant:

bool wal_txn_exists(struct filemgr *file)
{
    struct list_elem *le;
    struct wal_txn_wrapper *txn_wrapper;
    fdb_txn *txn;

    spin_lock(&file->wal->lock);

    le = list_begin(&file->wal->txn_list);
    while(le) {
        txn_wrapper = _get_entry(le, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;
        if (txn != &file->global_txn) {
            spin_unlock(&file->wal->lock);
            return true;
        }
        le = list_next(le);
    }
    spin_unlock(&file->wal->lock);

    return false;
}